

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::generateIterations
          (TextureGather2DArrayCase *this)

{
  TextureFormat *textureFormat;
  GatherType gatherType;
  pointer pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 uVar13;
  int iVar14;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  undefined1 local_88 [56];
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  TextureFormat *local_38;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  textureFormat = &(this->super_TextureGatherCase).m_textureFormat;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_88);
  local_38 = textureFormat;
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_88 + 0x30),gatherType,textureFormat,(IVec2 *)local_88);
  uVar7 = local_88._48_8_;
  if (-1 < (this->m_textureSize).m_data[2] + 1) {
    uVar8 = (int)((long)(local_50 - local_88._48_8_) >> 2) * 0x38e38e39;
    local_48._8_8_ = ZEXT48(uVar8 & 0x7fffffff);
    iVar14 = -1;
    do {
      if (iVar14 == 0) {
        uVar13 = local_48._8_8_;
        piVar10 = (int *)uVar7;
        if (0 < (int)uVar8) {
          do {
            local_88._36_4_ = 0;
            local_88._0_4_ = -1;
            local_88._20_4_ = 0;
            local_88._24_4_ = 0;
            local_88._28_4_ = 0;
            local_88._32_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            local_88._16_4_ = 0;
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ::push_back(&this->m_iterations,(value_type *)local_88);
            pIVar1 = (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pIVar1[-1].gatherArgs.offsets[3].m_data[1] = piVar10[8];
            iVar2 = *piVar10;
            iVar3 = piVar10[1];
            iVar4 = piVar10[2];
            iVar5 = piVar10[3];
            uVar6 = *(undefined8 *)(piVar10 + 6);
            *(undefined8 *)(pIVar1[-1].gatherArgs.offsets[1].m_data + 1) =
                 *(undefined8 *)(piVar10 + 4);
            *(undefined8 *)(pIVar1[-1].gatherArgs.offsets[2].m_data + 1) = uVar6;
            pIVar1[-1].gatherArgs.componentNdx = iVar2;
            pIVar1[-1].gatherArgs.offsets[0].m_data[0] = iVar3;
            pIVar1[-1].gatherArgs.offsets[0].m_data[1] = iVar4;
            pIVar1[-1].gatherArgs.offsets[1].m_data[0] = iVar5;
            (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = 0;
            uVar13 = uVar13 - 1;
            piVar10 = piVar10 + 9;
          } while (uVar13 != 0);
        }
      }
      else if (0 < (int)uVar8) {
        uVar9 = iVar14 + 5;
        if (-1 < (int)(iVar14 + 2U)) {
          uVar9 = iVar14 + 2U;
        }
        uVar12 = 0;
        piVar10 = (int *)uVar7;
        do {
          if ((local_38->order == D) || (local_38->order == DS)) {
            uVar12 = 0;
LAB_0165f967:
            local_88._36_4_ = 0;
            local_88._0_4_ = -1;
            local_88._20_4_ = 0;
            local_88._24_4_ = 0;
            local_88._28_4_ = 0;
            local_88._32_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            local_88._16_4_ = 0;
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ::push_back(&this->m_iterations,(value_type *)local_88);
            pIVar1 = (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pIVar1[-1].gatherArgs.offsets[3].m_data[1] = *(int *)(uVar7 + uVar12 * 0x24 + 0x20);
            piVar10 = (int *)(uVar7 + uVar12 * 0x24);
            iVar2 = *piVar10;
            iVar3 = piVar10[1];
            iVar4 = piVar10[2];
            iVar5 = piVar10[3];
            uVar13 = *(undefined8 *)((pointer)(uVar7 + uVar12 * 0x24 + 0x10) + 8);
            *(undefined8 *)(pIVar1[-1].gatherArgs.offsets[1].m_data + 1) =
                 *(undefined8 *)(uVar7 + uVar12 * 0x24 + 0x10);
            *(undefined8 *)(pIVar1[-1].gatherArgs.offsets[2].m_data + 1) = uVar13;
            pIVar1[-1].gatherArgs.componentNdx = iVar2;
            pIVar1[-1].gatherArgs.offsets[0].m_data[0] = iVar3;
            pIVar1[-1].gatherArgs.offsets[0].m_data[1] = iVar4;
            pIVar1[-1].gatherArgs.offsets[1].m_data[0] = iVar5;
            (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = iVar14;
            break;
          }
          if (*piVar10 == (iVar14 - (uVar9 & 0xfffffffc)) + 2) goto LAB_0165f967;
          uVar11 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar11;
          piVar10 = piVar10 + 9;
        } while (uVar8 != uVar11);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < (this->m_textureSize).m_data[2] + 1);
  }
  if ((int *)local_88._48_8_ == (int *)0x0) {
    return;
  }
  operator_delete((void *)local_88._48_8_,local_48._M_allocated_capacity - local_88._48_8_);
  return;
}

Assistant:

void TextureGather2DArrayCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	// \note Out-of-bounds layer indices are tested too.
	for (int layerNdx = -1; layerNdx < m_textureSize.z()+1; layerNdx++)
	{
		// Don't duplicate all cases for all layers.
		if (layerNdx == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().layerNdx = layerNdx;
			}
		}
		else
		{
			// For other layers than 0, only test one component and one set of offsets per layer.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == (layerNdx + 2) % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().layerNdx = layerNdx;
					break;
				}
			}
		}
	}
}